

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainerContainer.h
# Opt level: O1

void crampl::
     ContainerContainer<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>_>
     ::sizeCheck(tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<double,_std::allocator<double>_>_&>
                 *containers)

{
  runtime_error *this;
  bool result;
  optional<unsigned_long> firstSize;
  char local_21;
  undefined1 local_20 [8];
  undefined1 local_18;
  
  local_18 = 0;
  local_21 = '\x01';
  crampl::detail::
  for_each_in_tuple_impl<crampl::ContainerContainer<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>::sizeCheck(std::tuple<std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&>)::_lambda(auto:1_const&)_1_,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,0ul,1ul>
            (containers,local_20,&local_21);
  if (local_21 != '\0') {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid container sizes");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void sizeCheck(std::tuple<Containers&...> containers) {
        std::optional<std::size_t> firstSize{};
        bool result = true;
        detail::for_each_in_tuple(containers, [&](const auto &c) {
            if (firstSize)
                result &= *firstSize == c.size();
            else
                firstSize = c.size();
        });
        if (!result)
            throw std::runtime_error("invalid container sizes");
    }